

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCharType.cpp
# Opt level: O2

void __thiscall hdc::UCharType::UCharType(UCharType *this,Token *token)

{
  PrimitiveType::PrimitiveType(&this->super_PrimitiveType);
  (this->super_PrimitiveType).super_Type.super_ASTNode._vptr_ASTNode =
       (_func_int **)&PTR_accept_0019a770;
  (this->token).lexem._M_dataplus._M_p = (pointer)&(this->token).lexem.field_2;
  (this->token).lexem._M_string_length = 0;
  (this->token).lexem.field_2._M_local_buf[0] = '\0';
  Token::operator=(&this->token,token);
  (this->super_PrimitiveType).super_Type.super_ASTNode.kind = AST_UCHAR_TYPE;
  return;
}

Assistant:

UCharType::UCharType(Token& token) {
    this->token = token;
    this->kind = AST_UCHAR_TYPE;
}